

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  long lVar1;
  ostream *poVar2;
  PmxModel x;
  filebuf fb;
  istream is;
  
  if (argc == 2) {
    std::filebuf::filebuf(&fb);
    lVar1 = std::filebuf::open((char *)&fb,(_Ios_Openmode)argv[1]);
    if (lVar1 == 0) {
      poVar2 = std::operator<<((ostream *)&std::cout,"Can\'t open the ");
      poVar2 = std::operator<<(poVar2,argv[1]);
      poVar2 = std::operator<<(poVar2,", please check");
      std::endl<char,std::char_traits<char>>(poVar2);
      exit(-1);
    }
    std::istream::istream(&is,(streambuf *)&fb);
    x.model_name._M_dataplus._M_p = (pointer)&x.model_name.field_2;
    x.version = 0.0;
    x.setting.encoding = '\0';
    x.setting.uv = '\0';
    x.setting.vertex_index_size = '\0';
    x.setting.texture_index_size = '\0';
    x.setting.material_index_size = '\0';
    x.setting.bone_index_size = '\0';
    x.setting.morph_index_size = '\0';
    x.setting.rigidbody_index_size = '\0';
    x.model_name._M_string_length = 0;
    x.model_name.field_2._M_local_buf[0] = '\0';
    x.model_english_name._M_dataplus._M_p = (pointer)&x.model_english_name.field_2;
    x.model_english_name._M_string_length = 0;
    x.model_english_name.field_2._M_local_buf[0] = '\0';
    x.model_comment._M_dataplus._M_p = (pointer)&x.model_comment.field_2;
    x.model_comment._M_string_length = 0;
    x.model_comment.field_2._M_local_buf[0] = '\0';
    x.model_english_comment._M_dataplus._M_p = (pointer)&x.model_english_comment.field_2;
    x.model_english_comment._M_string_length = 0;
    x.model_english_comment.field_2._M_local_buf[0] = '\0';
    x.vertex_count = 0;
    x.vertices._M_t.super___uniq_ptr_impl<pmx::PmxVertex,_std::default_delete<pmx::PmxVertex[]>_>.
    _M_t.super__Tuple_impl<0UL,_pmx::PmxVertex_*,_std::default_delete<pmx::PmxVertex[]>_>.
    super__Head_base<0UL,_pmx::PmxVertex_*,_false>._M_head_impl =
         (__uniq_ptr_data<pmx::PmxVertex,_std::default_delete<pmx::PmxVertex[]>,_true,_true>)
         (__uniq_ptr_impl<pmx::PmxVertex,_std::default_delete<pmx::PmxVertex[]>_>)0x0;
    x.index_count = 0;
    x.indices._M_t.super___uniq_ptr_impl<int,_std::default_delete<int[]>_>._M_t.
    super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>.super__Head_base<0UL,_int_*,_false>.
    _M_head_impl = (__uniq_ptr_data<int,_std::default_delete<int[]>,_true,_true>)
                   (__uniq_ptr_impl<int,_std::default_delete<int[]>_>)0x0;
    x.texture_count = 0;
    x.textures._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>[]>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>[]>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl =
         (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>[]>,_true,_true>
          )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>[]>_>
            )0x0;
    x.material_count = 0;
    x.materials._M_t.
    super___uniq_ptr_impl<pmx::PmxMaterial,_std::default_delete<pmx::PmxMaterial[]>_>._M_t.
    super__Tuple_impl<0UL,_pmx::PmxMaterial_*,_std::default_delete<pmx::PmxMaterial[]>_>.
    super__Head_base<0UL,_pmx::PmxMaterial_*,_false>._M_head_impl =
         (__uniq_ptr_data<pmx::PmxMaterial,_std::default_delete<pmx::PmxMaterial[]>,_true,_true>)
         (__uniq_ptr_impl<pmx::PmxMaterial,_std::default_delete<pmx::PmxMaterial[]>_>)0x0;
    x.bone_count = 0;
    x.bones._M_t.super___uniq_ptr_impl<pmx::PmxBone,_std::default_delete<pmx::PmxBone[]>_>._M_t.
    super__Tuple_impl<0UL,_pmx::PmxBone_*,_std::default_delete<pmx::PmxBone[]>_>.
    super__Head_base<0UL,_pmx::PmxBone_*,_false>._M_head_impl =
         (__uniq_ptr_data<pmx::PmxBone,_std::default_delete<pmx::PmxBone[]>,_true,_true>)
         (__uniq_ptr_impl<pmx::PmxBone,_std::default_delete<pmx::PmxBone[]>_>)0x0;
    x.morph_count = 0;
    x.morphs._M_t.super___uniq_ptr_impl<pmx::PmxMorph,_std::default_delete<pmx::PmxMorph[]>_>._M_t.
    super__Tuple_impl<0UL,_pmx::PmxMorph_*,_std::default_delete<pmx::PmxMorph[]>_>.
    super__Head_base<0UL,_pmx::PmxMorph_*,_false>._M_head_impl =
         (__uniq_ptr_data<pmx::PmxMorph,_std::default_delete<pmx::PmxMorph[]>,_true,_true>)
         (__uniq_ptr_impl<pmx::PmxMorph,_std::default_delete<pmx::PmxMorph[]>_>)0x0;
    x.frame_count = 0;
    x.frames._M_t.super___uniq_ptr_impl<pmx::PmxFrame,_std::default_delete<pmx::PmxFrame[]>_>._M_t.
    super__Tuple_impl<0UL,_pmx::PmxFrame_*,_std::default_delete<pmx::PmxFrame[]>_>.
    super__Head_base<0UL,_pmx::PmxFrame_*,_false>._M_head_impl =
         (__uniq_ptr_data<pmx::PmxFrame,_std::default_delete<pmx::PmxFrame[]>,_true,_true>)
         (__uniq_ptr_impl<pmx::PmxFrame,_std::default_delete<pmx::PmxFrame[]>_>)0x0;
    x.rigid_body_count = 0;
    x.rigid_bodies._M_t.
    super___uniq_ptr_impl<pmx::PmxRigidBody,_std::default_delete<pmx::PmxRigidBody[]>_>._M_t.
    super__Tuple_impl<0UL,_pmx::PmxRigidBody_*,_std::default_delete<pmx::PmxRigidBody[]>_>.
    super__Head_base<0UL,_pmx::PmxRigidBody_*,_false>._M_head_impl =
         (__uniq_ptr_data<pmx::PmxRigidBody,_std::default_delete<pmx::PmxRigidBody[]>,_true,_true>)
         (__uniq_ptr_impl<pmx::PmxRigidBody,_std::default_delete<pmx::PmxRigidBody[]>_>)0x0;
    x.joint_count = 0;
    x.joints._M_t.super___uniq_ptr_impl<pmx::PmxJoint,_std::default_delete<pmx::PmxJoint[]>_>._M_t.
    super__Tuple_impl<0UL,_pmx::PmxJoint_*,_std::default_delete<pmx::PmxJoint[]>_>.
    super__Head_base<0UL,_pmx::PmxJoint_*,_false>._M_head_impl =
         (__uniq_ptr_data<pmx::PmxJoint,_std::default_delete<pmx::PmxJoint[]>,_true,_true>)
         (__uniq_ptr_impl<pmx::PmxJoint,_std::default_delete<pmx::PmxJoint[]>_>)0x0;
    x.soft_body_count = 0;
    x.soft_bodies._M_t.
    super___uniq_ptr_impl<pmx::PmxSoftBody,_std::default_delete<pmx::PmxSoftBody[]>_>._M_t.
    super__Tuple_impl<0UL,_pmx::PmxSoftBody_*,_std::default_delete<pmx::PmxSoftBody[]>_>.
    super__Head_base<0UL,_pmx::PmxSoftBody_*,_false>._M_head_impl =
         (__uniq_ptr_data<pmx::PmxSoftBody,_std::default_delete<pmx::PmxSoftBody[]>,_true,_true>)
         (__uniq_ptr_impl<pmx::PmxSoftBody,_std::default_delete<pmx::PmxSoftBody[]>_>)0x0;
    pmx::PmxModel::Read(&x,&is);
    *(undefined8 *)(&__cxxabiv1::__si_class_type_info::vtable + *(long *)(std::cout + -0x18)) = 0x18
    ;
    poVar2 = std::operator<<((ostream *)&std::cout,"PMX version");
    poVar2 = std::operator<<(poVar2,":");
    lVar1 = *(long *)poVar2;
    *(undefined8 *)(poVar2 + *(long *)(lVar1 + -0x18) + 0x10) = 0x18;
    lVar1 = *(long *)(lVar1 + -0x18);
    *(uint *)(poVar2 + lVar1 + 0x18) = *(uint *)(poVar2 + lVar1 + 0x18) & 0xffffff4f | 0x80;
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,x.version);
    std::endl<char,std::char_traits<char>>(poVar2);
    *(undefined8 *)(&__cxxabiv1::__si_class_type_info::vtable + *(long *)(std::cout + -0x18)) = 0x18
    ;
    poVar2 = std::operator<<((ostream *)&std::cout,"Model Name");
    poVar2 = std::operator<<(poVar2,":");
    lVar1 = *(long *)poVar2;
    *(undefined8 *)(poVar2 + *(long *)(lVar1 + -0x18) + 0x10) = 0x18;
    lVar1 = *(long *)(lVar1 + -0x18);
    *(uint *)(poVar2 + lVar1 + 0x18) = *(uint *)(poVar2 + lVar1 + 0x18) & 0xffffff4f | 0x80;
    poVar2 = std::operator<<(poVar2,(string *)&x.model_name);
    std::endl<char,std::char_traits<char>>(poVar2);
    *(undefined8 *)(&__cxxabiv1::__si_class_type_info::vtable + *(long *)(std::cout + -0x18)) = 0x18
    ;
    poVar2 = std::operator<<((ostream *)&std::cout,"Model English Name");
    poVar2 = std::operator<<(poVar2,":");
    lVar1 = *(long *)poVar2;
    *(undefined8 *)(poVar2 + *(long *)(lVar1 + -0x18) + 0x10) = 0x18;
    lVar1 = *(long *)(lVar1 + -0x18);
    *(uint *)(poVar2 + lVar1 + 0x18) = *(uint *)(poVar2 + lVar1 + 0x18) & 0xffffff4f | 0x80;
    poVar2 = std::operator<<(poVar2,(string *)&x.model_english_name);
    std::endl<char,std::char_traits<char>>(poVar2);
    *(undefined8 *)(&__cxxabiv1::__si_class_type_info::vtable + *(long *)(std::cout + -0x18)) = 0x18
    ;
    poVar2 = std::operator<<((ostream *)&std::cout,"Comment");
    poVar2 = std::operator<<(poVar2,":");
    lVar1 = *(long *)poVar2;
    *(undefined8 *)(poVar2 + *(long *)(lVar1 + -0x18) + 0x10) = 0x18;
    lVar1 = *(long *)(lVar1 + -0x18);
    *(uint *)(poVar2 + lVar1 + 0x18) = *(uint *)(poVar2 + lVar1 + 0x18) & 0xffffff4f | 0x80;
    poVar2 = std::operator<<(poVar2,(string *)&x.model_comment);
    std::endl<char,std::char_traits<char>>(poVar2);
    *(undefined8 *)(&__cxxabiv1::__si_class_type_info::vtable + *(long *)(std::cout + -0x18)) = 0x18
    ;
    poVar2 = std::operator<<((ostream *)&std::cout,"English Comment");
    poVar2 = std::operator<<(poVar2,":");
    lVar1 = *(long *)poVar2;
    *(undefined8 *)(poVar2 + *(long *)(lVar1 + -0x18) + 0x10) = 0x18;
    lVar1 = *(long *)(lVar1 + -0x18);
    *(uint *)(poVar2 + lVar1 + 0x18) = *(uint *)(poVar2 + lVar1 + 0x18) & 0xffffff4f | 0x80;
    poVar2 = std::operator<<(poVar2,(string *)&x.model_english_comment);
    std::endl<char,std::char_traits<char>>(poVar2);
    *(undefined8 *)(&__cxxabiv1::__si_class_type_info::vtable + *(long *)(std::cout + -0x18)) = 0x18
    ;
    poVar2 = std::operator<<((ostream *)&std::cout,"#vertex");
    poVar2 = std::operator<<(poVar2,":");
    lVar1 = *(long *)poVar2;
    *(undefined8 *)(poVar2 + *(long *)(lVar1 + -0x18) + 0x10) = 0x18;
    lVar1 = *(long *)(lVar1 + -0x18);
    *(uint *)(poVar2 + lVar1 + 0x18) = *(uint *)(poVar2 + lVar1 + 0x18) & 0xffffff4f | 0x80;
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,x.vertex_count);
    std::endl<char,std::char_traits<char>>(poVar2);
    *(undefined8 *)(&__cxxabiv1::__si_class_type_info::vtable + *(long *)(std::cout + -0x18)) = 0x18
    ;
    poVar2 = std::operator<<((ostream *)&std::cout,"#index");
    poVar2 = std::operator<<(poVar2,":");
    lVar1 = *(long *)poVar2;
    *(undefined8 *)(poVar2 + *(long *)(lVar1 + -0x18) + 0x10) = 0x18;
    lVar1 = *(long *)(lVar1 + -0x18);
    *(uint *)(poVar2 + lVar1 + 0x18) = *(uint *)(poVar2 + lVar1 + 0x18) & 0xffffff4f | 0x80;
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,x.index_count);
    std::endl<char,std::char_traits<char>>(poVar2);
    *(undefined8 *)(&__cxxabiv1::__si_class_type_info::vtable + *(long *)(std::cout + -0x18)) = 0x18
    ;
    poVar2 = std::operator<<((ostream *)&std::cout,"#texture");
    poVar2 = std::operator<<(poVar2,":");
    lVar1 = *(long *)poVar2;
    *(undefined8 *)(poVar2 + *(long *)(lVar1 + -0x18) + 0x10) = 0x18;
    lVar1 = *(long *)(lVar1 + -0x18);
    *(uint *)(poVar2 + lVar1 + 0x18) = *(uint *)(poVar2 + lVar1 + 0x18) & 0xffffff4f | 0x80;
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,x.texture_count);
    std::endl<char,std::char_traits<char>>(poVar2);
    *(undefined8 *)(&__cxxabiv1::__si_class_type_info::vtable + *(long *)(std::cout + -0x18)) = 0x18
    ;
    poVar2 = std::operator<<((ostream *)&std::cout,"#material");
    poVar2 = std::operator<<(poVar2,":");
    lVar1 = *(long *)poVar2;
    *(undefined8 *)(poVar2 + *(long *)(lVar1 + -0x18) + 0x10) = 0x18;
    lVar1 = *(long *)(lVar1 + -0x18);
    *(uint *)(poVar2 + lVar1 + 0x18) = *(uint *)(poVar2 + lVar1 + 0x18) & 0xffffff4f | 0x80;
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,x.material_count);
    std::endl<char,std::char_traits<char>>(poVar2);
    *(undefined8 *)(&__cxxabiv1::__si_class_type_info::vtable + *(long *)(std::cout + -0x18)) = 0x18
    ;
    poVar2 = std::operator<<((ostream *)&std::cout,"#bone");
    poVar2 = std::operator<<(poVar2,":");
    lVar1 = *(long *)poVar2;
    *(undefined8 *)(poVar2 + *(long *)(lVar1 + -0x18) + 0x10) = 0x18;
    lVar1 = *(long *)(lVar1 + -0x18);
    *(uint *)(poVar2 + lVar1 + 0x18) = *(uint *)(poVar2 + lVar1 + 0x18) & 0xffffff4f | 0x80;
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,x.bone_count);
    std::endl<char,std::char_traits<char>>(poVar2);
    *(undefined8 *)(&__cxxabiv1::__si_class_type_info::vtable + *(long *)(std::cout + -0x18)) = 0x18
    ;
    poVar2 = std::operator<<((ostream *)&std::cout,"#morph");
    poVar2 = std::operator<<(poVar2,":");
    lVar1 = *(long *)poVar2;
    *(undefined8 *)(poVar2 + *(long *)(lVar1 + -0x18) + 0x10) = 0x18;
    lVar1 = *(long *)(lVar1 + -0x18);
    *(uint *)(poVar2 + lVar1 + 0x18) = *(uint *)(poVar2 + lVar1 + 0x18) & 0xffffff4f | 0x80;
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,x.morph_count);
    std::endl<char,std::char_traits<char>>(poVar2);
    *(undefined8 *)(&__cxxabiv1::__si_class_type_info::vtable + *(long *)(std::cout + -0x18)) = 0x18
    ;
    poVar2 = std::operator<<((ostream *)&std::cout,"#frame");
    poVar2 = std::operator<<(poVar2,":");
    lVar1 = *(long *)poVar2;
    *(undefined8 *)(poVar2 + *(long *)(lVar1 + -0x18) + 0x10) = 0x18;
    lVar1 = *(long *)(lVar1 + -0x18);
    *(uint *)(poVar2 + lVar1 + 0x18) = *(uint *)(poVar2 + lVar1 + 0x18) & 0xffffff4f | 0x80;
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,x.frame_count);
    std::endl<char,std::char_traits<char>>(poVar2);
    *(undefined8 *)(&__cxxabiv1::__si_class_type_info::vtable + *(long *)(std::cout + -0x18)) = 0x18
    ;
    poVar2 = std::operator<<((ostream *)&std::cout,"#rigid body");
    poVar2 = std::operator<<(poVar2,":");
    lVar1 = *(long *)poVar2;
    *(undefined8 *)(poVar2 + *(long *)(lVar1 + -0x18) + 0x10) = 0x18;
    lVar1 = *(long *)(lVar1 + -0x18);
    *(uint *)(poVar2 + lVar1 + 0x18) = *(uint *)(poVar2 + lVar1 + 0x18) & 0xffffff4f | 0x80;
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,x.rigid_body_count);
    std::endl<char,std::char_traits<char>>(poVar2);
    *(undefined8 *)(&__cxxabiv1::__si_class_type_info::vtable + *(long *)(std::cout + -0x18)) = 0x18
    ;
    poVar2 = std::operator<<((ostream *)&std::cout,"#joint");
    poVar2 = std::operator<<(poVar2,":");
    lVar1 = *(long *)poVar2;
    *(undefined8 *)(poVar2 + *(long *)(lVar1 + -0x18) + 0x10) = 0x18;
    lVar1 = *(long *)(lVar1 + -0x18);
    *(uint *)(poVar2 + lVar1 + 0x18) = *(uint *)(poVar2 + lVar1 + 0x18) & 0xffffff4f | 0x80;
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,x.joint_count);
    std::endl<char,std::char_traits<char>>(poVar2);
    *(undefined8 *)(&__cxxabiv1::__si_class_type_info::vtable + *(long *)(std::cout + -0x18)) = 0x18
    ;
    poVar2 = std::operator<<((ostream *)&std::cout,"#soft body");
    poVar2 = std::operator<<(poVar2,":");
    lVar1 = *(long *)poVar2;
    *(undefined8 *)(poVar2 + *(long *)(lVar1 + -0x18) + 0x10) = 0x18;
    lVar1 = *(long *)(lVar1 + -0x18);
    *(uint *)(poVar2 + lVar1 + 0x18) = *(uint *)(poVar2 + lVar1 + 0x18) & 0xffffff4f | 0x80;
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,x.soft_body_count);
    std::endl<char,std::char_traits<char>>(poVar2);
    pmx::PmxModel::~PmxModel(&x);
    std::istream::~istream(&is);
    std::filebuf::~filebuf(&fb);
  }
  else {
    poVar2 = std::operator<<((ostream *)&std::cout,"Usage: ./demo [PMX file path]");
    std::endl<char,std::char_traits<char>>(poVar2);
  }
  return 0;
}

Assistant:

int main(int argc, char *argv[]) {
    if(argc != 2) {
        std::cout << "Usage: ./demo [PMX file path]" << std::endl;
        return 0;
    }
    std::filebuf fb;
    if(!fb.open(argv[1], std::ios::in | std::ios::binary)) {
        std::cout << "Can't open the " << argv[1] << ", please check" << std::endl;
        exit(-1);
    }

    std::istream is(&fb);
    pmx::PmxModel x;
    x.Read(&is);
    
    PRINT("PMX version", x.version)
    PRINT("Model Name", x.model_name)
    PRINT("Model English Name", x.model_english_name)
    PRINT("Comment", x.model_comment)
    PRINT("English Comment", x.model_english_comment)
    PRINT("#vertex", x.vertex_count)
    PRINT("#index", x.index_count)
    PRINT("#texture", x.texture_count)
    PRINT("#material", x.material_count)
    PRINT("#bone", x.bone_count)
    PRINT("#morph", x.morph_count)
    PRINT("#frame", x.frame_count)
    PRINT("#rigid body", x.rigid_body_count)
    PRINT("#joint", x.joint_count)
    PRINT("#soft body", x.soft_body_count)
}